

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O2

int __thiscall
gl4cts::ParallelShaderCompileTests::init(ParallelShaderCompileTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  SimpleQueriesTest::SimpleQueriesTest
            ((SimpleQueriesTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MaxShaderCompileThreadsTest::MaxShaderCompileThreadsTest
            ((MaxShaderCompileThreadsTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  CompilationCompletionNonParallelTest::CompilationCompletionNonParallelTest
            ((CompilationCompletionNonParallelTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  CompilationCompletionParallelTest::CompilationCompletionParallelTest
            ((CompilationCompletionParallelTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ParallelShaderCompileTests::init()
{
	addChild(new SimpleQueriesTest(m_context));
	addChild(new MaxShaderCompileThreadsTest(m_context));
	addChild(new CompilationCompletionNonParallelTest(m_context));
	addChild(new CompilationCompletionParallelTest(m_context));
}